

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

decimal_fp<double> fmt::v9::detail::dragonbox::to_decimal<double>(double x)

{
  bool bVar1;
  compute_mul_parity_result cVar2;
  int iVar3;
  int iVar4;
  uint32_t uVar5;
  uint uVar6;
  unsigned_long uVar7;
  carrier_uint cVar8;
  uint64_t uVar9;
  compute_mul_result cVar10;
  decimal_fp<double> dVar11;
  compute_mul_parity_result y_mul;
  bool divisible_by_small_divisor;
  bool approx_y_parity;
  uint32_t dist;
  compute_mul_parity_result x_mul;
  uint32_t r;
  compute_mul_result z_mul;
  carrier_uint two_fc;
  uint32_t deltai;
  int beta;
  cache_entry_type cache;
  int minus_k;
  bool include_right_endpoint;
  bool include_left_endpoint;
  int exponent;
  carrier_uint significand;
  carrier_uint significand_mask;
  unsigned_long br;
  decimal_fp<double> ret_value;
  carrier_uint zi;
  carrier_uint xi;
  cache_entry_type cache_1;
  int beta_1;
  int minus_k_1;
  decimal_fp<double> ret_value_1;
  uint64_t q;
  uint64_t q_3;
  int s;
  uint64_t mod_inv_25;
  uint64_t mod_inv_5;
  uint32_t q_1;
  uint32_t q_2;
  int s_1;
  uint32_t mod_inv_25_1;
  uint32_t mod_inv_5_1;
  uint32_t n32;
  uint128_fallback nm;
  uint64_t magic_number;
  uint64_t q_4;
  uint64_t q_7;
  int s_2;
  uint64_t mod_inv_25_2;
  uint64_t mod_inv_5_2;
  uint32_t q_5;
  uint32_t q_6;
  int s_3;
  uint32_t mod_inv_25_3;
  uint32_t mod_inv_5_3;
  uint32_t n32_1;
  uint128_fallback nm_1;
  uint64_t magic_number_1;
  int in_stack_fffffffffffffdec;
  cache_entry_type *in_stack_fffffffffffffdf0;
  uint64_t in_stack_fffffffffffffdf8;
  cache_entry_type *in_stack_fffffffffffffe00;
  undefined8 in_stack_fffffffffffffe08;
  int beta_00;
  undefined4 in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe14;
  undefined4 in_stack_fffffffffffffe18;
  carrier_uint in_stack_fffffffffffffe20;
  bool local_190;
  bool bStack_18f;
  bool bStack_185;
  uint local_184;
  undefined8 in_stack_fffffffffffffe80;
  int k;
  int local_144;
  ulong local_140;
  double local_128;
  uint64_t local_120;
  int local_118;
  ulong local_110;
  carrier_uint local_108;
  uint128_fallback local_100;
  int local_ec;
  int local_e8;
  int local_e4;
  ulong local_e0;
  int local_d8;
  uint64_t local_d0;
  uint64_t local_c8;
  uint local_bc;
  undefined8 local_b8;
  undefined8 local_b0;
  uint32_t local_a8;
  uint32_t local_a4;
  uint local_a0;
  undefined4 local_9c;
  undefined4 local_98;
  uint32_t local_94;
  uint128_fallback local_90;
  undefined8 local_80;
  uint64_t *local_78;
  uint local_6c;
  uint64_t local_68;
  uint64_t local_60;
  uint local_54;
  undefined8 local_50;
  undefined8 local_48;
  uint32_t local_40;
  uint32_t local_3c;
  uint local_38;
  undefined4 local_34;
  undefined4 local_30;
  uint32_t local_2c;
  uint128_fallback local_28;
  undefined8 local_18;
  uint64_t *local_10;
  uint local_4;
  
  beta_00 = (int)((ulong)in_stack_fffffffffffffe08 >> 0x20);
  k = (int)((ulong)in_stack_fffffffffffffe80 >> 0x20);
  uVar7 = bit_cast<unsigned_long,_double,_0>(&local_128);
  local_140 = uVar7 & 0xfffffffffffff;
  cVar8 = exponent_mask<double>();
  iVar3 = num_significand_bits<double>();
  local_144 = (int)((uVar7 & cVar8) >> ((byte)iVar3 & 0x3f));
  if (local_144 == 0) {
    if (local_140 == 0) {
      local_120 = 0;
      local_118 = 0;
      goto LAB_001cd635;
    }
    local_144 = num_significand_bits<double>();
    local_144 = -0x3fe - local_144;
  }
  else {
    iVar3 = exponent_bias<double>();
    iVar4 = num_significand_bits<double>();
    local_144 = local_144 - (iVar3 + iVar4);
    if (local_140 == 0) {
      local_e4 = local_144;
      local_e8 = floor_log10_pow2_minus_log10_4_over_3(0);
      iVar3 = local_e4;
      local_ec = floor_log2_pow10(0);
      local_ec = iVar3 + local_ec;
      local_100 = cache_accessor<double>::get_cached_power(k);
      local_108 = cache_accessor<double>::compute_left_endpoint_for_shorter_interval_case
                            (in_stack_fffffffffffffe00,(int)(in_stack_fffffffffffffdf8 >> 0x20));
      local_110 = cache_accessor<double>::compute_right_endpoint_for_shorter_interval_case
                            (in_stack_fffffffffffffe00,(int)(in_stack_fffffffffffffdf8 >> 0x20));
      bVar1 = is_left_endpoint_integer_shorter_interval<double>(local_e4);
      if (!bVar1) {
        local_108 = local_108 + 1;
      }
      local_e0 = local_110 / 10;
      if (local_e0 * 10 < local_108) {
        local_e0 = cache_accessor<double>::compute_round_up_for_shorter_interval_case
                             (in_stack_fffffffffffffdf0,in_stack_fffffffffffffdec);
        local_d8 = local_e8;
        if ((local_e4 < -0x4d) || (-0x4d < local_e4)) {
          if (local_e0 < local_108) {
            local_e0 = local_e0 + 1;
          }
        }
        else if ((local_e0 & 1) != 0) {
          local_e0 = local_e0 - 1;
        }
      }
      else {
        local_d8 = local_e8 + 1;
        local_78 = &local_e0;
        if (local_e0 == 0) {
          assert_fail((char *)in_stack_fffffffffffffdf0,in_stack_fffffffffffffdec,(char *)0x1ccbdb);
        }
        local_80 = 0xabcc77118461cefd;
        local_90 = umul128((uint64_t)in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
        uVar9 = uint128_fallback::high(&local_90);
        if (((uVar9 & 0x3ffffff) == 0) &&
           (uVar9 = uint128_fallback::low(&local_90), uVar9 < 0xabcc77118461cefd)) {
          uVar9 = uint128_fallback::high(&local_90);
          local_94 = (uint32_t)(uVar9 >> 0x1a);
          local_98 = 0xcccccccd;
          local_9c = 0xc28f5c29;
          local_a0 = 8;
          while( true ) {
            uVar5 = rotr(local_94 * -0x3d70a3d7,2);
            local_a4 = uVar5;
            uVar6 = max_value<unsigned_int>();
            if (uVar6 / 100 < uVar5) break;
            local_94 = local_a4;
            local_a0 = local_a0 + 2;
          }
          uVar5 = rotr(local_94 * -0x33333333,1);
          local_a8 = uVar5;
          uVar6 = max_value<unsigned_int>();
          if (uVar5 <= uVar6 / 10) {
            local_94 = local_a8;
            local_a0 = local_a0 | 1;
          }
          *local_78 = (ulong)local_94;
          local_6c = local_a0;
        }
        else {
          local_b0 = 0xcccccccccccccccd;
          local_b8 = 0x8f5c28f5c28f5c29;
          local_bc = 0;
          while( true ) {
            uVar9 = rotr(*local_78 * -0x70a3d70a3d70a3d7,2);
            local_c8 = uVar9;
            uVar7 = max_value<unsigned_long>();
            if (uVar7 / 100 < uVar9) break;
            *local_78 = local_c8;
            local_bc = local_bc + 2;
          }
          uVar9 = rotr(*local_78 * -0x3333333333333333,1);
          local_d0 = uVar9;
          uVar7 = max_value<unsigned_long>();
          if (uVar9 <= uVar7 / 10) {
            *local_78 = local_d0;
            local_bc = local_bc | 1;
          }
          local_6c = local_bc;
        }
        local_d8 = local_6c + local_d8;
      }
      local_120 = local_e0;
      local_118 = local_d8;
      goto LAB_001cd635;
    }
    iVar3 = num_significand_bits<double>();
    local_140 = 1L << ((byte)iVar3 & 0x3f) | local_140;
  }
  bVar1 = (local_140 & 1) == 0;
  iVar3 = floor_log10_pow2(0);
  cache_accessor<double>::get_cached_power(k);
  floor_log2_pow10(0);
  uVar5 = cache_accessor<double>::compute_delta(in_stack_fffffffffffffdf0,in_stack_fffffffffffffdec)
  ;
  cVar10 = cache_accessor<double>::compute_mul
                     (in_stack_fffffffffffffe20,
                      (cache_entry_type *)CONCAT44(local_144,in_stack_fffffffffffffe18));
  local_120 = divide_by_10_to_kappa_plus_1(0x1cd0b1);
  local_184 = (int)cVar10.result + (int)local_120 * -1000;
  if (local_184 < uVar5) {
    if ((local_184 != 0) || ((cVar10.is_integer & 1U & !bVar1) == 0)) {
LAB_001cd1af:
      local_118 = iVar3 + 1;
      local_10 = &local_120;
      if (local_120 == 0) {
        assert_fail((char *)in_stack_fffffffffffffdf0,in_stack_fffffffffffffdec,(char *)0x1cd253);
      }
      local_18 = 0xabcc77118461cefd;
      local_28 = umul128((uint64_t)in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
      uVar9 = uint128_fallback::high(&local_28);
      if (((uVar9 & 0x3ffffff) == 0) &&
         (uVar9 = uint128_fallback::low(&local_28), uVar9 < 0xabcc77118461cefd)) {
        uVar9 = uint128_fallback::high(&local_28);
        local_2c = (uint32_t)(uVar9 >> 0x1a);
        local_30 = 0xcccccccd;
        local_34 = 0xc28f5c29;
        local_38 = 8;
        while( true ) {
          uVar5 = rotr(local_2c * -0x3d70a3d7,2);
          local_3c = uVar5;
          uVar6 = max_value<unsigned_int>();
          if (uVar6 / 100 < uVar5) break;
          local_2c = local_3c;
          local_38 = local_38 + 2;
        }
        uVar5 = rotr(local_2c * -0x33333333,1);
        local_40 = uVar5;
        uVar6 = max_value<unsigned_int>();
        if (uVar5 <= uVar6 / 10) {
          local_2c = local_40;
          local_38 = local_38 | 1;
        }
        *local_10 = (ulong)local_2c;
        local_4 = local_38;
      }
      else {
        local_48 = 0xcccccccccccccccd;
        local_50 = 0x8f5c28f5c28f5c29;
        local_54 = 0;
        while( true ) {
          uVar9 = rotr(*local_10 * -0x70a3d70a3d70a3d7,2);
          local_60 = uVar9;
          uVar7 = max_value<unsigned_long>();
          if (uVar7 / 100 < uVar9) break;
          *local_10 = local_60;
          local_54 = local_54 + 2;
        }
        uVar9 = rotr(*local_10 * -0x3333333333333333,1);
        local_68 = uVar9;
        uVar7 = max_value<unsigned_long>();
        if (uVar9 <= uVar7 / 10) {
          *local_10 = local_68;
          local_54 = local_54 | 1;
        }
        local_4 = local_54;
      }
      local_118 = local_4 + local_118;
      goto LAB_001cd635;
    }
    local_120 = local_120 - 1;
    local_184 = 1000;
  }
  else if (local_184 <= uVar5) {
    cVar2 = cache_accessor<double>::compute_mul_parity
                      (CONCAT44(local_144,in_stack_fffffffffffffe18),
                       (cache_entry_type *)
                       CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),beta_00);
    bStack_185 = cVar2.is_integer;
    if (((ushort)cVar2 & 1) != 0 || (bStack_185 & 1U & bVar1) != 0) goto LAB_001cd1af;
  }
  local_120 = local_120 * 10;
  uVar6 = (local_184 - (uVar5 >> 1)) + 0x32;
  local_118 = iVar3;
  bVar1 = check_divisibility_and_divide_by_pow10<2>((uint32_t *)in_stack_fffffffffffffe00);
  local_120 = uVar6 + local_120;
  if (bVar1) {
    cVar2 = cache_accessor<double>::compute_mul_parity
                      (CONCAT44(local_144,in_stack_fffffffffffffe18),
                       (cache_entry_type *)
                       CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),beta_00);
    local_190 = cVar2.parity;
    if ((bool)(local_190 & 1U) == ((uVar6 & 1) != 0)) {
      bStack_18f = cVar2.is_integer;
      if ((bStack_18f & 1U & (local_120 & 1) != 0) != 0) {
        local_120 = local_120 - 1;
      }
    }
    else {
      local_120 = local_120 - 1;
    }
  }
LAB_001cd635:
  dVar11.exponent = local_118;
  dVar11.significand = local_120;
  dVar11._12_4_ = 0;
  return dVar11;
}

Assistant:

decimal_fp<T> to_decimal(T x) noexcept {
  // Step 1: integer promotion & Schubfach multiplier calculation.

  using carrier_uint = typename float_info<T>::carrier_uint;
  using cache_entry_type = typename cache_accessor<T>::cache_entry_type;
  auto br = bit_cast<carrier_uint>(x);

  // Extract significand bits and exponent bits.
  const carrier_uint significand_mask =
      (static_cast<carrier_uint>(1) << num_significand_bits<T>()) - 1;
  carrier_uint significand = (br & significand_mask);
  int exponent =
      static_cast<int>((br & exponent_mask<T>()) >> num_significand_bits<T>());

  if (exponent != 0) {  // Check if normal.
    exponent -= exponent_bias<T>() + num_significand_bits<T>();

    // Shorter interval case; proceed like Schubfach.
    // In fact, when exponent == 1 and significand == 0, the interval is
    // regular. However, it can be shown that the end-results are anyway same.
    if (significand == 0) return shorter_interval_case<T>(exponent);

    significand |= (static_cast<carrier_uint>(1) << num_significand_bits<T>());
  } else {
    // Subnormal case; the interval is always regular.
    if (significand == 0) return {0, 0};
    exponent =
        std::numeric_limits<T>::min_exponent - num_significand_bits<T>() - 1;
  }

  const bool include_left_endpoint = (significand % 2 == 0);
  const bool include_right_endpoint = include_left_endpoint;

  // Compute k and beta.
  const int minus_k = floor_log10_pow2(exponent) - float_info<T>::kappa;
  const cache_entry_type cache = cache_accessor<T>::get_cached_power(-minus_k);
  const int beta = exponent + floor_log2_pow10(-minus_k);

  // Compute zi and deltai.
  // 10^kappa <= deltai < 10^(kappa + 1)
  const uint32_t deltai = cache_accessor<T>::compute_delta(cache, beta);
  const carrier_uint two_fc = significand << 1;

  // For the case of binary32, the result of integer check is not correct for
  // 29711844 * 2^-82
  // = 6.1442653300000000008655037797566933477355632930994033813476... * 10^-18
  // and 29711844 * 2^-81
  // = 1.2288530660000000001731007559513386695471126586198806762695... * 10^-17,
  // and they are the unique counterexamples. However, since 29711844 is even,
  // this does not cause any problem for the endpoints calculations; it can only
  // cause a problem when we need to perform integer check for the center.
  // Fortunately, with these inputs, that branch is never executed, so we are
  // fine.
  const typename cache_accessor<T>::compute_mul_result z_mul =
      cache_accessor<T>::compute_mul((two_fc | 1) << beta, cache);

  // Step 2: Try larger divisor; remove trailing zeros if necessary.

  // Using an upper bound on zi, we might be able to optimize the division
  // better than the compiler; we are computing zi / big_divisor here.
  decimal_fp<T> ret_value;
  ret_value.significand = divide_by_10_to_kappa_plus_1(z_mul.result);
  uint32_t r = static_cast<uint32_t>(z_mul.result - float_info<T>::big_divisor *
                                                        ret_value.significand);

  if (r < deltai) {
    // Exclude the right endpoint if necessary.
    if (r == 0 && (z_mul.is_integer & !include_right_endpoint)) {
      --ret_value.significand;
      r = float_info<T>::big_divisor;
      goto small_divisor_case_label;
    }
  } else if (r > deltai) {
    goto small_divisor_case_label;
  } else {
    // r == deltai; compare fractional parts.
    const typename cache_accessor<T>::compute_mul_parity_result x_mul =
        cache_accessor<T>::compute_mul_parity(two_fc - 1, cache, beta);

    if (!(x_mul.parity | (x_mul.is_integer & include_left_endpoint)))
      goto small_divisor_case_label;
  }
  ret_value.exponent = minus_k + float_info<T>::kappa + 1;

  // We may need to remove trailing zeros.
  ret_value.exponent += remove_trailing_zeros(ret_value.significand);
  return ret_value;

  // Step 3: Find the significand with the smaller divisor.

small_divisor_case_label:
  ret_value.significand *= 10;
  ret_value.exponent = minus_k + float_info<T>::kappa;

  uint32_t dist = r - (deltai / 2) + (float_info<T>::small_divisor / 2);
  const bool approx_y_parity =
      ((dist ^ (float_info<T>::small_divisor / 2)) & 1) != 0;

  // Is dist divisible by 10^kappa?
  const bool divisible_by_small_divisor =
      check_divisibility_and_divide_by_pow10<float_info<T>::kappa>(dist);

  // Add dist / 10^kappa to the significand.
  ret_value.significand += dist;

  if (!divisible_by_small_divisor) return ret_value;

  // Check z^(f) >= epsilon^(f).
  // We have either yi == zi - epsiloni or yi == (zi - epsiloni) - 1,
  // where yi == zi - epsiloni if and only if z^(f) >= epsilon^(f).
  // Since there are only 2 possibilities, we only need to care about the
  // parity. Also, zi and r should have the same parity since the divisor
  // is an even number.
  const auto y_mul = cache_accessor<T>::compute_mul_parity(two_fc, cache, beta);

  // If z^(f) >= epsilon^(f), we might have a tie when z^(f) == epsilon^(f),
  // or equivalently, when y is an integer.
  if (y_mul.parity != approx_y_parity)
    --ret_value.significand;
  else if (y_mul.is_integer & (ret_value.significand % 2 != 0))
    --ret_value.significand;
  return ret_value;
}